

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O1

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  *(undefined ***)this = &PTR__spdlog_ex_004ed898;
  paVar1 = &(this->msg_).field_2;
  (this->msg_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (msg->_M_dataplus)._M_p;
  paVar2 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&msg->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->msg_).field_2 + 8) = uVar4;
  }
  else {
    (this->msg_)._M_dataplus._M_p = pcVar3;
    (this->msg_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->msg_)._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar2;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(std::string msg)
    : msg_(std::move(msg)) {}